

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

void __thiscall
pbrt::RGBFilm::AddSample
          (RGBFilm *this,Point2i *pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *param_4,Float weight)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Pixel *pPVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [64];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  float fVar10;
  undefined1 auVar11 [64];
  RGB RVar12;
  initializer_list<float> __l;
  undefined8 local_30;
  float local_28;
  SampledSpectrum L_local;
  
  auVar11._8_56_ = L._16_56_;
  auVar11._0_8_ = L.values.values._8_8_;
  auVar7._8_56_ = L._8_56_;
  auVar7._0_8_ = L.values.values._0_8_;
  L_local.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar11._0_16_);
  auVar9 = ZEXT856(L_local.values.values._8_8_);
  RVar12 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&L_local,lambda);
  fVar10 = RVar12.b;
  auVar8._0_8_ = RVar12._0_8_;
  auVar8._8_56_ = auVar9;
  local_30 = vmovlps_avx(auVar8._0_16_);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_30;
  local_28 = fVar10;
  fVar5 = std::max<float>(__l);
  fVar6 = this->maxComponentValue / fVar5;
  auVar1 = vmovshdup_avx(auVar8._0_16_);
  bVar2 = this->maxComponentValue < fVar5;
  pPVar3 = Array2D<pbrt::RGBFilm::Pixel>::operator[]
                     (&this->pixels,(Point2i)pFilm->super_Tuple2<pbrt::Point2,_int>);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    fVar5 = (float)((uint)bVar2 * (int)(RVar12.r * fVar6) + (uint)!bVar2 * (int)RVar12.r);
    if (((int)lVar4 != 0) &&
       (fVar5 = (float)((uint)bVar2 * (int)(auVar1._0_4_ * fVar6) + (uint)!bVar2 * (int)auVar1._0_4_
                       ), (int)lVar4 != 1)) {
      fVar5 = (float)((uint)bVar2 * (int)(fVar10 * fVar6) + (uint)!bVar2 * (int)fVar10);
    }
    pPVar3->rgbSum[lVar4] = (double)(fVar5 * weight) + pPVar3->rgbSum[lVar4];
  }
  pPVar3->weightSum = (double)weight + pPVar3->weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU
    void AddSample(const Point2i &pFilm, SampledSpectrum L,
                   const SampledWavelengths &lambda, const VisibleSurface *,
                   Float weight) {
        // Convert sample radiance to _PixelSensor_ RGB
        RGB rgb = sensor->ToSensorRGB(L, lambda);

        // Optionally clamp sensor RGB value
        Float m = std::max({rgb.r, rgb.g, rgb.b});
        if (m > maxComponentValue) {
            rgb *= maxComponentValue / m;
        }

        DCHECK(InsideExclusive(pFilm, pixelBounds));
        // Update pixel values with filtered sample contribution
        Pixel &pixel = pixels[pFilm];
        for (int c = 0; c < 3; ++c)
            pixel.rgbSum[c] += weight * rgb[c];
        pixel.weightSum += weight;
    }